

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyCore.cpp
# Opt level: O2

string * __thiscall
helics::EmptyCore::query_abi_cxx11_
          (string *__return_storage_ptr__,EmptyCore *this,string_view target,string_view queryStr,
          HelicsSequencingModes param_3)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__s;
  string *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  allocator<char> local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __y._M_str = "core";
  __y._M_len = 4;
  bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)target,__y);
  if (bVar1) {
LAB_002f7672:
    __y_01._M_str = "queries";
    __y_01._M_len = 7;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_01);
    if ((bVar1) ||
       (__y_02._M_str = "available_queries", __y_02._M_len = 0x11,
       bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_02),
       bVar1)) {
      __s = 
      "[\"isinit\",\"isconnected\",\"exists\",\"name\",\"identifier\",\"address\",\"queries\",\"address\",\"federates\",\"inputs\",\"endpoints\",\"filtered_endpoints\",\"publications\",\"filters\",\"tags\",\"version\",\"version_all\",\"federate_map\",\"dependency_graph\",\"data_flow_graph\",\"dependencies\",\"dependson\",\"dependents\",\"current_time\",\"global_time\",\"global_state\",\"global_flush\",\"current_state\"]"
      ;
LAB_002f76ab:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_70);
      return __return_storage_ptr__;
    }
    __y_03._M_str = "isconnected";
    __y_03._M_len = 0xb;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_03);
    if ((bVar1) ||
       (__y_04._M_str = "isinit", __y_04._M_len = 6,
       bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_04),
       bVar1)) {
      __s = "false";
      goto LAB_002f76ab;
    }
    __y_05._M_str = "name";
    __y_05._M_len = 4;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_05);
    if ((bVar1) ||
       (__y_06._M_str = "identifier", __y_06._M_len = 10,
       bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_06),
       bVar1)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\"",&local_71);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &local_50,"null");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     '\"');
    }
    else {
      __y_07._M_str = "exists";
      __y_07._M_len = 6;
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_07);
      if (bVar1) {
        __s = "true";
        goto LAB_002f76ab;
      }
      __y_08._M_str = "version";
      __y_08._M_len = 7;
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_08);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Core is disconnected",(allocator<char> *)&local_50);
        generateJsonErrorResponse(__return_storage_ptr__,DISCONNECTED,&local_70);
        goto LAB_002f76e2;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\"",&local_71);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &local_50,"3.6.1 (2025-02-24)");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     '\"');
    }
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = (string *)&local_50;
  }
  else {
    iVar2 = (*(this->super_Core)._vptr_Core[0xc])(this);
    __y_00._M_str = *(char **)CONCAT44(extraout_var,iVar2);
    __y_00._M_len = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)target,__y_00);
    if (target._M_len == 0 || bVar1) goto LAB_002f7672;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Federate is disconnected",(allocator<char> *)&local_50);
    generateJsonErrorResponse(__return_storage_ptr__,DISCONNECTED,&local_70);
LAB_002f76e2:
    this_00 = &local_70;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string EmptyCore::query(std::string_view target,
                             std::string_view queryStr,
                             HelicsSequencingModes /*mode*/)
{
    if (target == "core" || target == getIdentifier() || target.empty()) {
        return quickCoreQueries(queryStr);
    }
    return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Federate is disconnected");
}